

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestCaseInfo::internalAppendTag(TestCaseInfo *this,StringRef tagStr)

{
  char *pcVar1;
  StringRef local_50;
  StringRef local_40;
  size_type local_30;
  size_type backingEnd;
  size_type backingStart;
  TestCaseInfo *this_local;
  StringRef tagStr_local;
  
  tagStr_local.m_start = (char *)tagStr.m_size;
  this_local = (TestCaseInfo *)tagStr.m_start;
  backingStart = (size_type)this;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->backingTags,'[');
  backingEnd = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (&this->backingTags);
  operator+=(&this->backingTags,(StringRef *)&this_local);
  local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (&this->backingTags);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->backingTags,']');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->backingLCaseTags,'[');
  operator+=(&this->backingLCaseTags,(StringRef *)&this_local);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->backingLCaseTags,']');
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->backingTags);
  StringRef::StringRef(&local_40,pcVar1 + backingEnd,local_30 - backingEnd);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->backingLCaseTags);
  StringRef::StringRef(&local_50,pcVar1 + backingEnd,local_30 - backingEnd);
  std::vector<Catch::Tag,std::allocator<Catch::Tag>>::
  emplace_back<Catch::StringRef,Catch::StringRef>
            ((vector<Catch::Tag,std::allocator<Catch::Tag>> *)&this->tags,&local_40,&local_50);
  return;
}

Assistant:

void TestCaseInfo::internalAppendTag(StringRef tagStr) {
        backingTags += '[';
        const auto backingStart = backingTags.size();
        backingTags += tagStr;
        const auto backingEnd = backingTags.size();
        backingTags += ']';
        backingLCaseTags += '[';
        // We append the tag to the lower-case backing storage as-is,
        // because we will perform the lower casing later, in bulk
        backingLCaseTags += tagStr;
        backingLCaseTags += ']';
        tags.emplace_back(StringRef(backingTags.c_str() + backingStart, backingEnd - backingStart),
            StringRef(backingLCaseTags.c_str() + backingStart, backingEnd - backingStart));
    }